

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChessEngine.cpp
# Opt level: O3

string * __thiscall
senjo::ChessEngine::Go
          (string *__return_storage_ptr__,ChessEngine *this,int depth,int movestogo,
          uint64_t movetime,uint64_t wtime,uint64_t winc,uint64_t btime,uint64_t binc,string *ponder
          )

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  uint64_t uVar4;
  timeval tv;
  
  _stop._0_1_ = (byte)_stop & 0xfd;
  _searching = 1;
  gettimeofday((timeval *)&tv,(__timezone_ptr_t)0x0);
  _startTime = tv.tv_usec / 1000 + tv.tv_sec * 1000;
  _stopTime = _startTime + movetime;
  if (movetime == 0) {
    _stopTime = 0;
  }
  iVar2 = (*this->_vptr_ChessEngine[0xd])(this);
  uVar4 = btime;
  if ((char)iVar2 != '\0') {
    uVar4 = wtime;
  }
  if (uVar4 != 0) {
    iVar2 = movestogo;
    if (movestogo == 0) {
      iVar2 = (*this->_vptr_ChessEngine[0x11])(this);
    }
    uVar3 = uVar4 / (ulong)(long)iVar2 + _startTime;
    if (uVar3 <= _stopTime - 1) {
      _stopTime = uVar3;
    }
  }
  iVar2 = (*this->_vptr_ChessEngine[0x12])(this);
  if ((char)iVar2 != '\0') {
    bVar1 = Thread::Active(&this->timerThread);
    if (!bVar1) {
      bVar1 = Thread::Start(&this->timerThread,Timer,this);
      if (!bVar1) {
        Output::Output((Output *)&tv,InfoPrefix);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Failed to start timer thread!",0x1d);
        Output::~Output((Output *)&tv);
      }
    }
  }
  (*this->_vptr_ChessEngine[0x27])
            (__return_storage_ptr__,this,(ulong)(uint)depth,(ulong)(uint)movestogo,movetime,wtime,
             winc,btime,binc,ponder);
  _searching = 0;
  return __return_storage_ptr__;
}

Assistant:

std::string ChessEngine::Go(const int depth,
                            const int movestogo,
                            const uint64_t movetime,
                            const uint64_t wtime, const uint64_t winc,
                            const uint64_t btime, const uint64_t binc,
                            std::string* ponder)
{
  _stop &= ~StopReason::Timeout;
  _searching = true;
  _startTime = Now();

  // set _stopTime to something smarter in MyGo() if you wish
  _stopTime = (movetime ? (_startTime + movetime) : 0);
  const uint64_t timeRemaining = (WhiteToMove() ? wtime : btime);
  if (timeRemaining) {
    const int moves = (movestogo ? movestogo : MovesToGo());
    const uint64_t timePerMove = (timeRemaining / moves);
    const uint64_t endTime = (_startTime + timePerMove);
    if (!_stopTime || (endTime < _stopTime)) {
      _stopTime = endTime;
    }
  }

  if (UseTimer() && !timerThread.Active()) {
    if (!timerThread.Start(Timer, this)) {
      Output() << "Failed to start timer thread!";
    }
  }

  std::string bestmove =
      MyGo(depth, movestogo, movetime, wtime, winc, btime, binc, ponder);

  _searching = false;
  return bestmove;
}